

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Array * __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::Array::resize(Array *this,int64_t b,int64_t t)

{
  Array *i_00;
  Array *in_RDX;
  Array *in_RSI;
  int64_t i;
  Array *ptr;
  int64_t in_stack_ffffffffffffffa8;
  Array *i_01;
  Array *in_stack_ffffffffffffffb0;
  Array *this_00;
  Array *local_38;
  
  i_00 = (Array *)operator_new(0x18);
  Array(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_38 = in_RDX; local_38 != in_RSI; local_38 = (Array *)((long)&local_38->C + 1)) {
    i_01 = i_00;
    this_00 = local_38;
    pop(local_38,(int64_t)i_00);
    push(this_00,(int64_t)i_01,(Node *)0x1141e7);
  }
  return i_00;
}

Assistant:

Array* resize(int64_t b, int64_t t) {
      Array* ptr = new Array {2*C};
      for(int64_t i=t; i!=b; ++i) {
        ptr->push(i, pop(i));
      }
      return ptr;
    }